

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

vector<Data_*,_std::allocator<Data_*>_> * __thiscall
Bracket::genParaData(Bracket *this,Runtime *runtime)

{
  bool bVar1;
  int iVar2;
  vector<Data_*,_std::allocator<Data_*>_> *this_00;
  size_type __n;
  reference ppAVar3;
  undefined4 extraout_var;
  reference ppDVar4;
  _Self local_50;
  int local_44;
  iterator iStack_40;
  int i;
  iterator cursor;
  allocator<Data_*> local_21;
  vector<Data_*,_std::allocator<Data_*>_> *local_20;
  vector<Data_*,_std::allocator<Data_*>_> *result;
  Runtime *runtime_local;
  Bracket *this_local;
  
  result = (vector<Data_*,_std::allocator<Data_*>_> *)runtime;
  runtime_local = (Runtime *)this;
  this_00 = (vector<Data_*,_std::allocator<Data_*>_> *)operator_new(0x18);
  cursor._M_node._3_1_ = 1;
  __n = std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::size(&this->para);
  std::allocator<Data_*>::allocator(&local_21);
  std::vector<Data_*,_std::allocator<Data_*>_>::vector(this_00,__n,&local_21);
  cursor._M_node._3_1_ = 0;
  std::allocator<Data_*>::~allocator(&local_21);
  local_20 = this_00;
  iStack_40 = std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
  local_44 = 0;
  while( true ) {
    local_50._M_node =
         (_List_node_base *)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::end(&this->para);
    bVar1 = std::operator!=(&stack0xffffffffffffffc0,&local_50);
    if (!bVar1) break;
    ppAVar3 = std::_List_iterator<Atom_*>::operator*(&stack0xffffffffffffffc0);
    iVar2 = (*(*ppAVar3)->_vptr_Atom[3])(*ppAVar3,result);
    ppDVar4 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](local_20,(long)local_44);
    *ppDVar4 = (value_type)CONCAT44(extraout_var,iVar2);
    std::_List_iterator<Atom_*>::operator++(&stack0xffffffffffffffc0,0);
    local_44 = local_44 + 1;
  }
  return local_20;
}

Assistant:

std::vector<Data *> *Bracket::genParaData(Runtime *runtime) {
    auto result = new std::vector<Data *>(para.size());
    auto cursor = para.begin();
    auto i = 0;
    while (cursor != para.end()) {
        (*result)[i] = (*cursor)->eval(runtime);
        cursor++;
        i++;
    }
    return result;
}